

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O0

string * __thiscall
iuRenameParamTest::MakeTestParamName_abi_cxx11_
          (string *__return_storage_ptr__,iuRenameParamTest *this,TestParamInfo<bool> *info)

{
  TestParamInfo<bool> *info_local;
  
  iutest::StreamableToString<bool>(__return_storage_ptr__,(bool *)this);
  return __return_storage_ptr__;
}

Assistant:

static const ::std::string MakeTestParamName(const iutest::TestParamInfo<bool>& info)
    {
        return ::iutest::StreamableToString(info.param);
    }